

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

string * __thiscall
cli::Parser::howto_required_abi_cxx11_(string *__return_storage_ptr__,Parser *this,CmdBase *command)

{
  bool bVar1;
  ostream *poVar2;
  stringstream ss;
  char local_1a9;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"The parameter ",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,(command->name)._M_dataplus._M_p,(command->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is required.\n",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,(command->description)._M_dataplus._M_p,
                      (command->description)._M_string_length);
  local_1a9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a9,1);
  bVar1 = has_help(this);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"For more help use --help or -h.\n",0x20);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string howto_required(CmdBase* command) const {
			std::stringstream ss { };
			ss << "The parameter " << command->name << " is required.\n";
			ss << command->description << '\n';
			print_help(ss);
			return ss.str();
		}